

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDSharedSimd128.cpp
# Opt level: O0

Instr * __thiscall LowererMD::Simd128Instruction(LowererMD *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  Opnd *pOVar3;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar4;
  Instr *pInstr;
  Instr *instr_local;
  LowererMD *this_local;
  
  pOVar3 = IR::Instr::GetDst(instr);
  if (pOVar3 == (Opnd *)0x0) {
    this_00 = Func::GetJITFunctionBody(instr->m_func);
    bVar2 = JITTimeFunctionBody::IsAsmJsMode(this_00);
    if (bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDSharedSimd128.cpp"
                         ,0x22,"(!instr->m_func->GetJITFunctionBody()->IsAsmJsMode())",
                         "!instr->m_func->GetJITFunctionBody()->IsAsmJsMode()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    this_local = (LowererMD *)instr->m_prev;
    IR::Instr::Remove(instr);
  }
  else {
    bVar2 = Simd128TryLowerMappedInstruction(this,instr);
    if (bVar2) {
      this_local = (LowererMD *)instr->m_prev;
    }
    else {
      this_local = (LowererMD *)Simd128LowerUnMappedInstruction(this,instr);
    }
  }
  return (Instr *)this_local;
}

Assistant:

IR::Instr* LowererMD::Simd128Instruction(IR::Instr *instr)
{
    // Currently only handles type-specialized/asm.js opcodes

    if (!instr->GetDst())
    {
        // SIMD ops always have DST in asmjs
        Assert(!instr->m_func->GetJITFunctionBody()->IsAsmJsMode());
        // unused result. Do nothing.
        IR::Instr * pInstr = instr->m_prev;
        instr->Remove();
        return pInstr;
    }

    if (Simd128TryLowerMappedInstruction(instr))
    {
        return instr->m_prev;
    }
    return Simd128LowerUnMappedInstruction(instr);
}